

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<Symbol>::copyAppend(QGenericArrayOps<Symbol> *this,Symbol *b,Symbol *e)

{
  qsizetype *pqVar1;
  Symbol *pSVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  Token TVar6;
  
  if ((b != e) && (b < e)) {
    pSVar2 = (this->super_QArrayDataPointer<Symbol>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<Symbol>).size;
      TVar6 = b->token;
      pSVar2[lVar3].lineNum = b->lineNum;
      pSVar2[lVar3].token = TVar6;
      pDVar4 = (b->lex).d.d;
      pSVar2[lVar3].lex.d.d = pDVar4;
      pSVar2[lVar3].lex.d.ptr = (b->lex).d.ptr;
      pSVar2[lVar3].lex.d.size = (b->lex).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      qVar5 = b->len;
      pSVar2[lVar3].from = b->from;
      pSVar2[lVar3].len = qVar5;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<Symbol>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }